

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O2

int mpt_message_id2buf(uint64_t id,void *ptr,size_t len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if (len == 0) {
    iVar2 = -0x11;
    if (id == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  lVar3 = len - 1;
  iVar2 = 1;
  while( true ) {
    *(char *)((long)ptr + lVar3) = (char)id;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) break;
    iVar2 = (iVar2 + 1) - (uint)(id < 0x100);
    id = id >> 8;
  }
  if (id != 0) {
    return -0x11;
  }
  iVar1 = -2;
  if (-1 < *ptr) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int mpt_message_id2buf(uint64_t id, void *ptr, size_t len)
{
	uint8_t *buf = ptr;
	int used;
	if (!len--) {
		return id ? MPT_ERROR(MissingBuffer) : 0;
	}
	buf[len] = 0xff & id;
	used = 1;
	while (len--) {
		id /= 0x100;
		if (id) ++used;
		buf[len] = 0xff & id;
	}
	if (id) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((*buf & 0x80)) {
		return MPT_ERROR(BadValue);
	}
	return used;
}